

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t
scatter(ion_bpp_handle_t handle,ion_bpp_buffer_t *pbuf,ion_bpp_key_t *pkey,int is,
       ion_bpp_buffer_t **tmp)

{
  uint uVar1;
  char *pcVar2;
  ushort *puVar3;
  ion_bpp_buffer_t *handle_00;
  uint uVar4;
  ion_bpp_err_t iVar5;
  int iVar6;
  ion_bpp_address_t adr;
  ion_bpp_buffer_t *local_90;
  ion_bpp_buffer_t *buf;
  int local_80;
  int n;
  int i;
  int ct;
  int extra;
  int base;
  int len;
  int sw;
  int knMax;
  int k0Max;
  int knMin;
  int k0Min;
  int iu;
  ion_bpp_err_t rc;
  ion_bpp_key_t *gkey;
  ion_bpp_buffer_t *gbuf;
  ion_bpp_h_node_t *h;
  ion_bpp_buffer_t **tmp_local;
  ion_bpp_key_t *piStack_28;
  int is_local;
  ion_bpp_key_t *pkey_local;
  ion_bpp_buffer_t *pbuf_local;
  ion_bpp_handle_t handle_local;
  
  gkey = (ion_bpp_key_t *)((long)handle + 0x80);
  _iu = (void *)(*(long *)((long)handle + 0x98) + 0x20);
  n = (int)(**(ushort **)((long)handle + 0x98) >> 1);
  if ((**(ushort **)((long)handle + 0x98) & 1) == 0) {
    iVar6 = *(int *)((long)handle + 0xb8);
    len = *(int *)((long)handle + 0xb8);
    uVar1 = *(uint *)((long)handle + 0xb8);
    uVar4 = *(int *)((long)handle + 0xb8) + 1;
  }
  else {
    iVar6 = *(int *)((long)handle + 0xb8);
    len = *(int *)((long)handle + 0xb8) + -1;
    uVar1 = *(uint *)((long)handle + 0xb8);
    uVar4 = *(uint *)((long)handle + 0xb8);
  }
  k0Max = (uVar1 >> 1) + 1;
  knMax = (uVar4 >> 1) + 1;
  sw = iVar6 + -1;
  knMin = is;
  gbuf = (ion_bpp_buffer_t *)handle;
  h = (ion_bpp_h_node_t *)tmp;
  tmp_local._4_4_ = is;
  piStack_28 = pkey;
  pkey_local = (ion_bpp_key_t *)pbuf;
  pbuf_local = (ion_bpp_buffer_t *)handle;
  while( true ) {
    for (; (handle_00 = pbuf_local, knMin == 0 || (sw + (knMin + -1) * len < n)); knMin = knMin + 1)
    {
      adr = allocAdr(pbuf_local);
      iVar5 = assignBuf(handle_00,adr,(ion_bpp_buffer_t **)(&h->fp + knMin));
      if (iVar5 != bErrOk) {
        return iVar5;
      }
      if ((**(ushort **)(gkey + 0x18) & 1) != 0) {
        if (knMin == 0) {
          pcVar2 = h->fp->_IO_read_base;
          pcVar2[8] = '\0';
          pcVar2[9] = '\0';
          pcVar2[10] = '\0';
          pcVar2[0xb] = '\0';
          pcVar2[0xc] = '\0';
          pcVar2[0xd] = '\0';
          pcVar2[0xe] = '\0';
          pcVar2[0xf] = '\0';
          pcVar2 = h->fp->_IO_read_base;
          pcVar2[0x10] = '\0';
          pcVar2[0x11] = '\0';
          pcVar2[0x12] = '\0';
          pcVar2[0x13] = '\0';
          pcVar2[0x14] = '\0';
          pcVar2[0x15] = '\0';
          pcVar2[0x16] = '\0';
          pcVar2[0x17] = '\0';
        }
        else {
          *(char **)((&h->fp)[knMin]->_IO_read_base + 8) = (&h->fp)[knMin + -1]->_IO_read_end;
          *(undefined8 *)((&h->fp)[knMin]->_IO_read_base + 0x10) =
               *(undefined8 *)((&h->fp)[knMin + -1]->_IO_read_base + 0x10);
          *(char **)((&h->fp)[knMin + -1]->_IO_read_base + 0x10) = (&h->fp)[knMin]->_IO_read_end;
        }
      }
      nNodesIns = nNodesIns + 1;
      k0Min = 0;
    }
    if ((knMin < 2) || (k0Max + (knMin + -1) * knMax <= n)) break;
    iVar6 = knMin + -1;
    if (((**(ushort **)(gkey + 0x18) & 1) != 0) &&
       ((&h->fp)[knMin + -2]->_IO_read_end != (char *)0x0)) {
      *(undefined8 *)((&h->fp)[knMin + -2]->_IO_read_base + 0x10) =
           *(undefined8 *)((&h->fp)[iVar6]->_IO_read_base + 0x10);
    }
    *(undefined8 *)((&h->fp)[knMin + -2]->_IO_read_base + 0x10) =
         *(undefined8 *)((&h->fp)[iVar6]->_IO_read_base + 0x10);
    nNodesDel = nNodesDel + 1;
    knMin = iVar6;
  }
  ct = n / knMin;
  i = n % knMin;
  for (local_80 = 0; local_80 < knMin; local_80 = local_80 + 1) {
    buf._4_4_ = ct;
    if ((local_80 != 0) && (i != 0)) {
      buf._4_4_ = ct + 1;
      i = i + -1;
    }
    puVar3 = (ushort *)(&h->fp)[local_80]->_IO_read_base;
    *puVar3 = *puVar3 & 1 | (short)buf._4_4_ << 1;
  }
  if (knMin != tmp_local._4_4_) {
    if (((**(ushort **)(gkey + 0x18) & 1) != 0) &&
       (*(long *)((&h->fp)[knMin + -1]->_IO_read_base + 0x10) != 0)) {
      k0Min = readDisk(pbuf_local,*(ion_bpp_address_t *)((&h->fp)[knMin + -1]->_IO_read_base + 0x10)
                       ,&local_90);
      if (k0Min != bErrOk) {
        return k0Min;
      }
      local_90->p->prev = (ion_bpp_address_t)(&h->fp)[knMin + -1]->_IO_read_end;
      iVar5 = writeDisk(local_90);
      if (iVar5 != bErrOk) {
        return iVar5;
      }
      k0Min = 0;
    }
    base = (knMin - tmp_local._4_4_) * *(int *)((long)&gbuf[4].p + 4);
    if (base < 0) {
      extra = ((uint)(**(ushort **)(pkey_local + 0x18) >> 1) * *(int *)((long)&gbuf[4].p + 4) -
              ((int)piStack_28 - ((int)*(undefined8 *)(pkey_local + 0x18) + 0x20))) + base;
      memmove(piStack_28,piStack_28 + -(long)base,(long)extra);
    }
    else {
      extra = (uint)(**(ushort **)(pkey_local + 0x18) >> 1) * *(int *)((long)&gbuf[4].p + 4) -
              ((int)piStack_28 - ((int)*(undefined8 *)(pkey_local + 0x18) + 0x20));
      memmove(piStack_28 + base,piStack_28,(long)extra);
    }
    if (**(ushort **)(pkey_local + 0x18) >> 1 == 0) {
      puVar3 = *(ushort **)(pkey_local + 0x18);
      *puVar3 = *puVar3 & 1 | ((*puVar3 >> 1) + ((short)knMin - (short)tmp_local._4_4_) + -1) * 2;
    }
    else {
      puVar3 = *(ushort **)(pkey_local + 0x18);
      *puVar3 = *puVar3 & 1 | ((*puVar3 >> 1) + ((short)knMin - (short)tmp_local._4_4_)) * 2;
    }
  }
  for (local_80 = 0; local_80 < knMin; local_80 = local_80 + 1) {
    if ((**(ushort **)(gkey + 0x18) & 1) == 0) {
      if (local_80 == 0) {
        *(undefined8 *)(h->fp->_IO_read_base + 0x18) = *(undefined8 *)((long)_iu + -8);
        *(char **)(piStack_28 + -8) = h->fp->_IO_read_end;
      }
      else {
        *(undefined8 *)((&h->fp)[local_80]->_IO_read_base + 0x18) =
             *(undefined8 *)((long)_iu + (long)*(int *)&gbuf->prev + 8);
        memcpy(piStack_28,_iu,(long)*(int *)((long)&gbuf[4].p + 4));
        *(char **)(piStack_28 + (long)*(int *)&gbuf->prev + 8) = (&h->fp)[local_80]->_IO_read_end;
        _iu = (void *)((long)_iu + (long)*(int *)((long)&gbuf[4].p + 4));
        piStack_28 = piStack_28 + *(int *)((long)&gbuf[4].p + 4);
        puVar3 = (ushort *)(&h->fp)[local_80]->_IO_read_base;
        *puVar3 = *puVar3 & 1 | ((*puVar3 >> 1) - 1) * 2;
      }
    }
    else {
      pcVar2 = (&h->fp)[local_80]->_IO_read_base;
      pcVar2[0x18] = '\0';
      pcVar2[0x19] = '\0';
      pcVar2[0x1a] = '\0';
      pcVar2[0x1b] = '\0';
      pcVar2[0x1c] = '\0';
      pcVar2[0x1d] = '\0';
      pcVar2[0x1e] = '\0';
      pcVar2[0x1f] = '\0';
      if (local_80 == 0) {
        *(char **)(piStack_28 + -8) = h->fp->_IO_read_end;
      }
      else {
        memcpy(piStack_28,_iu,(long)*(int *)((long)&gbuf[4].p + 4));
        *(char **)(piStack_28 + (long)*(int *)&gbuf->prev + 8) = (&h->fp)[local_80]->_IO_read_end;
        piStack_28 = piStack_28 + *(int *)((long)&gbuf[4].p + 4);
      }
    }
    memcpy((&h->fp)[local_80]->_IO_read_base + 0x20,_iu,
           (long)(int)((uint)(*(ushort *)(&h->fp)[local_80]->_IO_read_base >> 1) *
                      *(int *)((long)&gbuf[4].p + 4)));
    puVar3 = (ushort *)(&h->fp)[local_80]->_IO_read_base;
    *puVar3 = *puVar3 & 0xfffe | **(ushort **)(gkey + 0x18) & 1;
    _iu = (void *)((long)_iu +
                  (long)(int)((uint)(*(ushort *)(&h->fp)[local_80]->_IO_read_base >> 1) *
                             *(int *)((long)&gbuf[4].p + 4)));
  }
  **(ushort **)(pkey_local + 0x18) = **(ushort **)(pkey_local + 0x18) & 0xfffe;
  handle_local._4_4_ = writeDisk((ion_bpp_buffer_t *)pkey_local);
  if (handle_local._4_4_ == bErrOk) {
    for (local_80 = 0; k0Min = 0, local_80 < knMin; local_80 = local_80 + 1) {
      iVar5 = writeDisk((ion_bpp_buffer_t *)(&h->fp)[local_80]);
      if (iVar5 != bErrOk) {
        return iVar5;
      }
    }
    handle_local._4_4_ = bErrOk;
  }
  return handle_local._4_4_;
}

Assistant:

static ion_bpp_err_t
scatter(
	ion_bpp_handle_t	handle,
	ion_bpp_buffer_t	*pbuf,
	ion_bpp_key_t		*pkey,
	int					is,
	ion_bpp_buffer_t	**tmp
) {
	ion_bpp_h_node_t	*h = handle;
	ion_bpp_buffer_t	*gbuf;				/* gather buf */
	ion_bpp_key_t		*gkey;			/* gather buf key */
	ion_bpp_err_t		rc;			/* return code */
	int					iu;		/* number of tmp's used */
	int					k0Min;	/* min #keys that can be mapped to tmp[0] */
	int					knMin;	/* min #keys that can be mapped to tmp[1..3] */
	int					k0Max;	/* max #keys that can be mapped to tmp[0] */
	int					knMax;	/* max #keys that can be mapped to tmp[1..3] */
	int					sw;		/* shift width */
	int					len;	/* length of remainder of buf */
	int					base;	/* base count distributed to tmps */
	int					extra;	/* extra counts */
	int					ct;
	int					i;

	/*
	 * input:
	 *   pbuf				   parent buffer of gathered keys
	 *   pkey				   where we insert a key if needed in parent
	 *   is					 number of supplied tmps
	 *   tmp					array of tmp's to be used for scattering
	 * output:
	 *   tmp					array of tmp's used for scattering
	*/

	/* scatter gbuf to tmps, placing 3/4 max in each tmp */

	gbuf	= &h->gbuf;
	gkey	= fkey(gbuf);
	ct		= ct(gbuf);

	/****************************************
	 * determine number of tmps to use (iu) *
	 ****************************************/
	iu		= is;

	/* determine limits */
	if (leaf(gbuf)) {
		/* minus 1 to allow for insertion */
		k0Max	= h->maxCt - 1;
		knMax	= h->maxCt - 1;
		/* plus 1 to allow for deletion */
		k0Min	= (h->maxCt / 2) + 1;
		knMin	= (h->maxCt / 2) + 1;
	}
	else {
		/* can hold an extra gbuf key as it's translated to a LT pointer */
		k0Max	= h->maxCt - 1;
		knMax	= h->maxCt;
		k0Min	= (h->maxCt / 2) + 1;
		knMin	= ((h->maxCt + 1) / 2) + 1;
	}

	/* calculate iu, number of tmps to use */
	while (1) {
		if ((iu == 0) || (ct > (k0Max + (iu - 1) * knMax))) {
			/* add a buffer */
			if ((rc = assignBuf(handle, allocAdr(handle), &tmp[iu])) != 0) {
				return rc;
			}

			/* update sequential links */
			if (leaf(gbuf)) {
				/* adjust sequential links */
				if (iu == 0) {
					/* no tmps supplied when splitting root for first time */
					prev(tmp[0])	= 0;
					next(tmp[0])	= 0;
				}
				else {
					prev(tmp[iu])		= tmp[iu - 1]->adr;
					next(tmp[iu])		= next(tmp[iu - 1]);
					next(tmp[iu - 1])	= tmp[iu]->adr;
				}
			}

			iu++;
			nNodesIns++;
		}
		else if ((iu > 1) && (ct < (k0Min + (iu - 1) * knMin))) {
			/* del a buffer */
			iu--;

			/* adjust sequential links */
			if (leaf(gbuf) && tmp[iu - 1]->adr) {
				next(tmp[iu - 1]) = next(tmp[iu]);
			}

			next(tmp[iu - 1]) = next(tmp[iu]);
			nNodesDel++;
		}
		else {
			break;
		}
	}

	/* establish count for each tmp used */
	base	= ct / iu;
	extra	= ct % iu;

	for (i = 0; i < iu; i++) {
		int n;

		n = base;

		/* distribute extras, one at a time */
		/* don't do to 1st node, as it may be internal and can't hold it */
		if (i && extra) {
			n++;
			extra--;
		}

		ct(tmp[i]) = n;
	}

	/**************************************
	 * update sequential links and parent *
	 **************************************/
	if (iu != is) {
		/* link last node to next */
		if (leaf(gbuf) && next(tmp[iu - 1])) {
			ion_bpp_buffer_t *buf;

			if ((rc = readDisk(handle, next(tmp[iu - 1]), &buf)) != 0) {
				return rc;
			}

			prev(buf) = tmp[iu - 1]->adr;

			if ((rc = writeDisk(buf)) != 0) {
				return rc;
			}
		}

		/* shift keys in parent */
		sw = ks(iu - is);

		if (sw < 0) {
			len = ks(ct(pbuf)) - (pkey - fkey(pbuf)) + sw;
			memmove(pkey, pkey - sw, len);
		}
		else {
			len = ks(ct(pbuf)) - (pkey - fkey(pbuf));
			memmove(pkey + sw, pkey, len);
		}

		/* don't count LT buffer for empty parent */
		if (ct(pbuf)) {
			ct(pbuf) += iu - is;
		}
		else {
			ct(pbuf) += iu - is - 1;
		}
	}

	/*******************************
	 * distribute keys to children *
	 *******************************/
	for (i = 0; i < iu; i++) {
		/* update LT pointer and parent nodes */
		if (leaf(gbuf)) {
			/* update LT, tmp[i] */
			childLT(fkey(tmp[i])) = 0;

			/* update parent */
			if (i == 0) {
				childLT(pkey) = tmp[i]->adr;
			}
			else {
				memcpy(pkey, gkey, ks(1));
				childGE(pkey)	= tmp[i]->adr;
				pkey			+= ks(1);
			}
		}
		else {
			if (i == 0) {
				/* update LT, tmp[0] */
				childLT(fkey(tmp[i]))	= childLT(gkey);
				/* update LT, parent */
				childLT(pkey)			= tmp[i]->adr;
			}
			else {
				/* update LT, tmp[i] */
				childLT(fkey(tmp[i]))	= childGE(gkey);
				/* update parent key */
				memcpy(pkey, gkey, ks(1));
				childGE(pkey)			= tmp[i]->adr;
				gkey					+= ks(1);
				pkey					+= ks(1);
				ct(tmp[i])--;
			}
		}

		/* install keys, tmp[i] */
		memcpy(fkey(tmp[i]), gkey, ks(ct(tmp[i])));
		leaf(tmp[i])	= leaf(gbuf);

		gkey			+= ks(ct(tmp[i]));
	}

	leaf(pbuf) = boolean_false;

	/************************
	 * write modified nodes *
	 ************************/
	if ((rc = writeDisk(pbuf)) != 0) {
		return rc;
	}

	for (i = 0; i < iu; i++) {
		if ((rc = writeDisk(tmp[i])) != 0) {
			return rc;
		}
	}

	return bErrOk;
}